

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O2

QRgbaFloat32 *
fetchARGBToRGBA32F<(QImage::Format)10>
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  float *pfVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  QRgbaFloat<float> QVar6;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)count;
  if (count < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 * 0x10 != uVar4; uVar4 = uVar4 + 0x10) {
    uVar2 = fetchPixel<(QPixelLayout::BPP)5>(src,index);
    uVar2 = convertPixelToARGB32PM<(QImage::Format)10>(uVar2);
    QVar6 = QRgbaFloat<float>::fromArgb32(uVar2);
    fVar5 = QVar6.a;
    pfVar1 = (float *)((long)&buffer->r + uVar4);
    *pfVar1 = QVar6.r * fVar5;
    pfVar1[1] = QVar6.g * fVar5;
    pfVar1[2] = fVar5 * QVar6.b;
    pfVar1[3] = fVar5;
    index = index + 1;
  }
  return buffer;
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchARGBToRGBA32F(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                      const QList<QRgb> *, QDitherInfo *)
{
    constexpr QPixelLayout::BPP bpp = bitsPerPixel<Format>();
    for (int i = 0; i < count; ++i)
        buffer[i] = convertPixelToRGBA32F<Format>(fetchPixel<bpp>(src, index + i)).premultiplied();
    return buffer;
}